

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay_estimator.cc
# Opt level: O1

void WebRtc_FreeBinaryDelayEstimatorFarend(BinaryDelayEstimatorFarend *self)

{
  if (self != (BinaryDelayEstimatorFarend *)0x0) {
    free(self->binary_far_history);
    self->binary_far_history = (uint32_t *)0x0;
    free(self->far_bit_counts);
    self->far_bit_counts = (int *)0x0;
    free(self);
    return;
  }
  return;
}

Assistant:

void WebRtc_FreeBinaryDelayEstimatorFarend(BinaryDelayEstimatorFarend* self) {

  if (self == NULL) {
    return;
  }

  free(self->binary_far_history);
  self->binary_far_history = NULL;

  free(self->far_bit_counts);
  self->far_bit_counts = NULL;

  free(self);
}